

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O0

void __thiscall antlr::CharScanner::match(CharScanner *this,string *s)

{
  uint uVar1;
  ulong uVar2;
  byte *pbVar3;
  undefined8 uVar4;
  ulong in_RSI;
  long *in_RDI;
  CharScanner *in_stack_00000008;
  bool in_stack_00000017;
  int in_stack_00000018;
  int in_stack_0000001c;
  int c;
  int la_1;
  size_t i;
  size_t len;
  ulong local_20;
  
  uVar2 = std::__cxx11::string::length();
  local_20 = 0;
  while( true ) {
    if (uVar2 <= local_20) {
      return;
    }
    uVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,1);
    pbVar3 = (byte *)std::__cxx11::string::operator[](in_RSI);
    if (uVar1 != *pbVar3) break;
    (**(code **)(*in_RDI + 0x40))();
    local_20 = local_20 + 1;
  }
  uVar4 = __cxa_allocate_exception(0x90);
  MismatchedCharException::MismatchedCharException
            (_c,in_stack_0000001c,in_stack_00000018,in_stack_00000017,in_stack_00000008);
  __cxa_throw(uVar4,&MismatchedCharException::typeinfo,
              MismatchedCharException::~MismatchedCharException);
}

Assistant:

virtual void match(const ANTLR_USE_NAMESPACE(std)string& s)
	{
		size_t len = s.length();

		for (size_t i = 0; i < len; i++)
		{
			// the & 0xFF is here to prevent sign extension lateron
			int la_1 = LA(1), c = (s[i] & 0xFF);

			if ( la_1 != c )
				throw MismatchedCharException(la_1, c, false, this);

			consume();
		}
	}